

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditDelibsTests.cpp
# Opt level: O1

int __thiscall dit::DecppTests::init(DecppTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"block_buffer",
             "de::BlockBuffer_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::BlockBuffer_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"file_path",
             "de::FilePath_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::FilePath_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"pool_array",
             "de::PoolArray_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::PoolArray_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"ring_buffer",
             "de::RingBuffer_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::RingBuffer_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"shared_ptr",
             "de::SharedPtr_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::SharedPtr_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "thread_safe_ring_buffer","de::ThreadSafeRingBuffer_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::ThreadSafeRingBuffer_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"unique_ptr",
             "de::UniquePtr_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::UniquePtr_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"random",
             "de::Random_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::Random_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"commandline",
             "de::cmdline::selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::cmdline::selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"array_buffer",
             "de::ArrayBuffer_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::ArrayBuffer_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"string_util",
             "de::StringUtil_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::StringUtil_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"spin_barrier",
             "de::SpinBarrier_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::SpinBarrier_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"stl_util",
             "de::STLUtil_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::STLUtil_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"append_list",
             "de::AppendList_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)de::AppendList_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SelfCheckCase(m_testCtx, "block_buffer",				"de::BlockBuffer_selfTest()",			de::BlockBuffer_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "file_path",					"de::FilePath_selfTest()",				de::FilePath_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "pool_array",					"de::PoolArray_selfTest()",				de::PoolArray_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "ring_buffer",				"de::RingBuffer_selfTest()",			de::RingBuffer_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "shared_ptr",					"de::SharedPtr_selfTest()",				de::SharedPtr_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "thread_safe_ring_buffer",	"de::ThreadSafeRingBuffer_selfTest()",	de::ThreadSafeRingBuffer_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "unique_ptr",					"de::UniquePtr_selfTest()",				de::UniquePtr_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "random",						"de::Random_selfTest()",				de::Random_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "commandline",				"de::cmdline::selfTest()",				de::cmdline::selfTest));
		addChild(new SelfCheckCase(m_testCtx, "array_buffer",				"de::ArrayBuffer_selfTest()",			de::ArrayBuffer_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "string_util",				"de::StringUtil_selfTest()",			de::StringUtil_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "spin_barrier",				"de::SpinBarrier_selfTest()",			de::SpinBarrier_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "stl_util",					"de::STLUtil_selfTest()",				de::STLUtil_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "append_list",				"de::AppendList_selfTest()",			de::AppendList_selfTest));
	}